

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void * SstFFSGetBlocksInfo(SstStream Stream,void *Variable)

{
  void *pvVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  FFSVarRec_conflict pFVar5;
  void *pvVar6;
  size_t *psVar7;
  int WriterRank;
  long lVar8;
  int i;
  ulong uVar9;
  
  pvVar1 = Stream->ReaderMarshalData;
  pFVar5 = LookupVarByKey(Stream,Variable);
  if (Stream->MinArraySetupUpcall == (MinArraySetupUpcallFunc)0x0) {
    pvVar6 = (void *)0x0;
  }
  else {
    lVar8 = **(long **)((long)pvVar1 + 0x20);
    pvVar6 = (*Stream->MinArraySetupUpcall)
                       (Stream->SetupUpcallReader,
                        *(int *)(lVar8 + *pFVar5->PerWriterMetaFieldOffset),
                        *(size_t **)(lVar8 + 0x10 + *pFVar5->PerWriterMetaFieldOffset));
    for (lVar8 = 0; lVar8 < Stream->WriterCohortSize; lVar8 = lVar8 + 1) {
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x20) + lVar8 * 8);
      sVar3 = pFVar5->PerWriterMetaFieldOffset[lVar8];
      for (uVar9 = 0; uVar9 < pFVar5->PerWriterBlockCount[lVar8]; uVar9 = uVar9 + 1) {
        lVar4 = *(long *)(lVar2 + 0x20 + sVar3);
        psVar7 = (size_t *)(lVar4 + *(long *)(lVar2 + sVar3) * uVar9 * 8);
        if (lVar4 == 0) {
          psVar7 = (size_t *)0x0;
        }
        (*Stream->ArrayBlocksInfoUpcall)
                  (Stream->SetupUpcallReader,pvVar6,pFVar5->Type,(int)lVar8,
                   (int)*(long *)(lVar2 + sVar3),*(size_t **)(lVar2 + 0x10 + sVar3),psVar7,
                   *(size_t **)(lVar2 + 0x18 + sVar3));
      }
    }
  }
  return pvVar6;
}

Assistant:

extern void *SstFFSGetBlocksInfo(SstStream Stream, void *Variable)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    FFSVarRec VarRec = LookupVarByKey(Stream, Variable);
    MetaArrayRec *meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[0]) +
                                               VarRec->PerWriterMetaFieldOffset[0]);
    if (!Stream->MinArraySetupUpcall)
        return NULL;

    void *Ret = Stream->MinArraySetupUpcall(Stream->SetupUpcallReader, (int)meta_base->Dims,
                                            meta_base->Shape);
    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[WriterRank]) +
                                     VarRec->PerWriterMetaFieldOffset[WriterRank]);

        for (int i = 0; i < VarRec->PerWriterBlockCount[WriterRank]; i++)
        {
            size_t *Offsets = NULL;
            if (meta_base->Offsets)
                Offsets = meta_base->Offsets + (i * meta_base->Dims);
            Stream->ArrayBlocksInfoUpcall(Stream->SetupUpcallReader, Ret, VarRec->Type, WriterRank,
                                          (int)meta_base->Dims, meta_base->Shape, Offsets,
                                          meta_base->Count);
        }
    }
    return Ret;
}